

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::createHiddenCursor(WindowImplX11 *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Cursor CVar3;
  XColor color;
  undefined1 local_30 [8];
  undefined4 local_28;
  undefined2 local_24;
  undefined1 local_22;
  
  uVar1 = XCreatePixmap(this->m_display,this->m_window,1,1,1);
  uVar2 = XCreateGC(this->m_display,uVar1,0,0);
  XDrawPoint(this->m_display,uVar1,uVar2,0,0);
  XFreeGC(this->m_display,uVar2);
  local_22 = 7;
  local_24 = 0;
  local_28 = 0;
  CVar3 = XCreatePixmapCursor(this->m_display,uVar1,uVar1,local_30,local_30,0,0);
  this->m_hiddenCursor = CVar3;
  XFreePixmap(this->m_display,uVar1);
  return;
}

Assistant:

void WindowImplX11::createHiddenCursor()
{
    // Create the cursor's pixmap (1x1 pixels)
    Pixmap cursorPixmap = XCreatePixmap(m_display, m_window, 1, 1, 1);
    GC graphicsContext = XCreateGC(m_display, cursorPixmap, 0, NULL);
    XDrawPoint(m_display, cursorPixmap, graphicsContext, 0, 0);
    XFreeGC(m_display, graphicsContext);

    // Create the cursor, using the pixmap as both the shape and the mask of the cursor
    XColor color;
    color.flags = DoRed | DoGreen | DoBlue;
    color.red = color.blue = color.green = 0;
    m_hiddenCursor = XCreatePixmapCursor(m_display, cursorPixmap, cursorPixmap, &color, &color, 0, 0);

    // We don't need the pixmap any longer, free it
    XFreePixmap(m_display, cursorPixmap);
}